

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O3

ScenarioLowerBound * __thiscall
despot::DSPOMDP::CreateScenarioLowerBound(DSPOMDP *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  RandomPolicy *this_00;
  undefined4 extraout_var;
  ScenarioLowerBound *this_01;
  ostream *poVar3;
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0)) {
    this_01 = (ScenarioLowerBound *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound((TrivialParticleLowerBound *)this_01,this);
    return this_01;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unsupported lower bound: ",0x19);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Supported types: TRIVIAL (default)");
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(1);
  }
  this_00 = (RandomPolicy *)operator_new(0x38);
  pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
  iVar2 = (*this->_vptr_DSPOMDP[0xe])(this,local_40);
  RandomPolicy::RandomPolicy(this_00,this,(ParticleLowerBound *)CONCAT44(extraout_var,iVar2));
  if (local_40[0] == local_30) {
    return (ScenarioLowerBound *)this_00;
  }
  operator_delete(local_40[0],local_30[0] + 1);
  return (ScenarioLowerBound *)this_00;
}

Assistant:

ScenarioLowerBound* DSPOMDP::CreateScenarioLowerBound(string name,
		string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
				CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL (default)" << endl;
		exit(1);
		return NULL;
	}
}